

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O1

pboolean p_socket_bind(PSocket *socket,PSocketAddress *address,pboolean allow_reuse,PError **error)

{
  int iVar1;
  pboolean pVar2;
  psize pVar3;
  pint value;
  sockaddr_storage addr;
  uint local_a4;
  sockaddr local_a0 [8];
  
  if ((socket == (PSocket *)0x0) || (address == (PSocketAddress *)0x0)) {
    p_socket_bind_cold_4();
  }
  else if ((socket->field_0x18 & 4) == 0) {
    local_a4 = (uint)(allow_reuse != 0);
    iVar1 = setsockopt(socket->fd,1,2,&local_a4,4);
    if (iVar1 < 0) {
      printf("** Warning: %s **\n","PSocket::p_socket_bind: setsockopt() with SO_REUSEADDR failed");
    }
    local_a4 = 0;
    if (allow_reuse != 0) {
      local_a4 = (uint)(socket->type == P_SOCKET_TYPE_DATAGRAM);
    }
    iVar1 = setsockopt(socket->fd,1,0xf,&local_a4,4);
    if (iVar1 < 0) {
      printf("** Warning: %s **\n","PSocket::p_socket_bind: setsockopt() with SO_REUSEPORT failed");
    }
    pVar2 = p_socket_address_to_native(address,local_a0,0x80);
    if (pVar2 == 0) {
      p_socket_bind_cold_3();
    }
    else {
      iVar1 = socket->fd;
      pVar3 = p_socket_address_get_native_size(address);
      iVar1 = bind(iVar1,local_a0,(socklen_t)pVar3);
      if (-1 < iVar1) {
        return 1;
      }
      p_socket_bind_cold_2();
    }
  }
  else {
    p_socket_bind_cold_1();
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_socket_bind (const PSocket	*socket,
	       PSocketAddress	*address,
	       pboolean		allow_reuse,
	       PError		**error)
{
	struct sockaddr_storage	addr;

#ifdef SO_REUSEPORT
	pboolean		reuse_port;
#endif

#ifdef P_OS_WIN
	pchar			value;
#else
	pint			value;
#endif

	if (P_UNLIKELY (socket == NULL || address == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	/* Windows allows to reuse the same address even for an active TCP
	 * connection, that's why on Windows we should use SO_REUSEADDR only
	 * for UDP sockets, UNIX doesn't have such behavior
	 *
	 * Ignore errors here, the only likely error is "not supported", and
	 * this is a "best effort" thing mainly */

#ifdef P_OS_WIN
	value = !! (pchar) (allow_reuse && (socket->type == P_SOCKET_TYPE_DATAGRAM));
#else
	value = !! (pint) allow_reuse;
#endif

	if (setsockopt (socket->fd, SOL_SOCKET, SO_REUSEADDR, &value, sizeof (value)) < 0)
		P_WARNING ("PSocket::p_socket_bind: setsockopt() with SO_REUSEADDR failed");

#ifdef SO_REUSEPORT
	reuse_port = allow_reuse && (socket->type == P_SOCKET_TYPE_DATAGRAM);

#  ifdef P_OS_WIN
	value = !! (pchar) reuse_port;
#  else
	value = !! (pint) reuse_port;
#  endif

	if (setsockopt (socket->fd, SOL_SOCKET, SO_REUSEPORT, &value, sizeof (value)) < 0)
		P_WARNING ("PSocket::p_socket_bind: setsockopt() with SO_REUSEPORT failed");
#endif

	if (P_UNLIKELY (p_socket_address_to_native (address, &addr, sizeof (addr)) == FALSE)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_FAILED,
				     0,
				     "Failed to convert socket address to native structure");
		return FALSE;
	}

	if (P_UNLIKELY (bind (socket->fd,
			      (struct sockaddr *) &addr,
			      (socklen_t) p_socket_address_get_native_size (address)) < 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call bind() on socket");
		return FALSE;
	}

	return TRUE;
}